

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

xmlAttrPtr xmlC14NFindHiddenParentAttr(xmlC14NCtxPtr ctx,xmlNodePtr cur,xmlChar *name,xmlChar *ns)

{
  int iVar1;
  xmlAttrPtr pxVar2;
  
  if (cur != (xmlNodePtr)0x0) {
    do {
      if (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) {
        return (xmlAttrPtr)0x0;
      }
      iVar1 = (*ctx->is_visible_callback)(ctx->user_data,cur,cur->parent);
      if (iVar1 != 0) {
        return (xmlAttrPtr)0x0;
      }
      pxVar2 = xmlHasNsProp(cur,name,(xmlChar *)"http://www.w3.org/XML/1998/namespace");
      if (pxVar2 != (xmlAttrPtr)0x0) {
        return pxVar2;
      }
      cur = cur->parent;
    } while (cur != (_xmlNode *)0x0);
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

static xmlAttrPtr
xmlC14NFindHiddenParentAttr(xmlC14NCtxPtr ctx, xmlNodePtr cur, const xmlChar * name, const xmlChar * ns)
{
    xmlAttrPtr res;
    while((cur != NULL) && (!xmlC14NIsVisible(ctx, cur, cur->parent))) {
        res = xmlHasNsProp(cur, name, ns);
        if(res != NULL) {
            return res;
        }

        cur = cur->parent;
    }

    return NULL;
}